

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_ml_early_term_after_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int64_t best_rd,
               int64_t part_none_rd,int64_t part_split_rd,int64_t *split_block_rd,
               PartitionSearchState *part_state)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  _Bool _Var4;
  int16_t iVar5;
  NN_CONFIG *pNVar6;
  long lVar7;
  ExtPartController *ext_part_controller;
  float *pfVar8;
  float *pfVar9;
  BLOCK_SIZE bsize;
  bool bVar10;
  byte bVar11;
  float fVar12;
  undefined4 uVar13;
  float fVar14;
  int in_stack_ffffffffffffd3c8;
  float local_2c34;
  int mi_col;
  float local_2c24;
  float local_2bf8;
  float local_2bf4;
  undefined4 local_2bf0;
  float local_2bec;
  undefined8 local_2be8;
  undefined8 uStack_2be0;
  undefined8 local_2bd8 [7];
  undefined8 uStack_2ba0;
  undefined8 local_2b98;
  float local_2b90;
  float local_2b8c;
  float fStack_2b88;
  undefined8 uStack_2b84;
  int min_bh;
  float local_2a44 [628];
  float score;
  int local_68;
  
  bVar11 = 0;
  if ((0x8000000000000001 < best_rd + 0x8000000000000001U) &&
     (part_state->terminate_partition_search == 0)) {
    bsize = (part_state->part_blk_params).bsize;
    iVar2 = (cpi->common).width;
    iVar3 = (cpi->common).height;
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
    if (bsize - 3 < 10) {
      iVar2 = (part_state->part_blk_params).mi_row;
      mi_col = (part_state->part_blk_params).mi_col;
      switch((uint)bsize) {
      case 3:
        local_2c34 = *(float *)(&DAT_004fc578 + (ulong)(0x1df < iVar3) * 4);
        pNVar6 = &av1_early_term_after_split_nnconfig_8;
        break;
      default:
        goto switchD_001ecdc4_caseD_4;
      case 6:
        local_2c34 = *(float *)(&DAT_004fc560 + (ulong)(0x1df < iVar3) * 4);
        pNVar6 = &av1_early_term_after_split_nnconfig_16;
        break;
      case 9:
        local_2c34 = *(float *)(&DAT_004fc568 + (ulong)(0x1df < iVar3) * 4);
        pNVar6 = &av1_early_term_after_split_nnconfig_32;
        break;
      case 0xc:
        local_2c34 = *(float *)(&DAT_004fc570 + (ulong)(0x1df < iVar3) * 4);
        pNVar6 = &av1_early_term_after_split_nnconfig_64;
      }
      iVar3 = (cpi->sf).part_sf.ml_early_term_after_part_split_level;
      lVar7 = 0;
      iVar5 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
      fStack_2b88 = 0.0;
      uStack_2b84 = 0;
      local_2b98 = 0;
      local_2b90 = 0.0;
      local_2b8c = 0.0;
      local_2bd8[6] = 0;
      uStack_2ba0 = 0;
      local_2bd8[4] = 0;
      local_2bd8[5] = 0;
      local_2bd8[2] = 0;
      local_2bd8[3] = 0;
      local_2bd8[0] = 0;
      local_2bd8[1] = 0;
      local_2be8 = 0;
      uStack_2be0 = 0;
      bVar1 = block_size_wide[bsize];
      local_2bf8 = log1pf((float)((int)iVar5 >> ((char)(x->e_mbd).bd - 8U & 0x1f)) * 0.25);
      fVar12 = (float)best_rd;
      local_2bf4 = log1pf(((fVar12 / (float)bVar1) / (float)bVar1) * 0.0009765625);
      bVar10 = part_none_rd - 1U < 0x7ffffffffffffffe;
      if (bVar10) {
        local_2bec = (float)part_none_rd / fVar12;
      }
      else {
        local_2bec = 1.0;
      }
      uVar13 = 0;
      local_2bf0 = 0x3f800000;
      if (!bVar10) {
        local_2bf0 = 0;
      }
      if (part_split_rd - 1U < 0x7ffffffffffffffe) {
        fVar14 = (float)part_split_rd / fVar12;
        uVar13 = 0x3f800000;
      }
      else {
        fVar14 = 1.0;
      }
      local_2c24 = local_2c34 + -0.3;
      local_2be8 = CONCAT44(fVar14,uVar13);
      do {
        bVar10 = *(long *)((long)split_block_rd + lVar7) - 1U < 0x7ffffffffffffffe;
        if (bVar10) {
          fVar14 = (float)*(long *)((long)split_block_rd + lVar7) / fVar12;
        }
        else {
          fVar14 = 1.0;
        }
        uVar13 = 0x3f800000;
        if (!bVar10) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)local_2bd8 + lVar7 * 2 + -8) = uVar13;
        *(float *)((long)local_2bd8 + lVar7 * 2 + -4) = fVar14;
        score = 9.80909e-45;
        min_bh = 7;
        get_min_bsize(*(SIMPLE_MOTION_DATA_TREE **)((long)sms_tree->split + lVar7),(int *)&score,
                      &min_bh);
        *(ulong *)((long)local_2bd8 + lVar7 * 2) = CONCAT44((float)min_bh,(float)(int)score);
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x20);
      if (1 < iVar3) {
        local_2c24 = local_2c34;
      }
      simple_motion_search_prune_part_features(cpi,x,sms_tree,iVar2,mi_col,bsize,(float *)0x0,7);
      fVar12 = log1pf((float)sms_tree->sms_none_feat[1]);
      uStack_2ba0 = CONCAT44(uStack_2ba0._4_4_,fVar12);
      fVar12 = log1pf((float)sms_tree->split[0]->sms_none_feat[1]);
      uStack_2ba0 = CONCAT44(fVar12,(undefined4)uStack_2ba0);
      fVar12 = log1pf((float)sms_tree->split[1]->sms_none_feat[1]);
      local_2b98 = CONCAT44(local_2b98._4_4_,fVar12);
      fVar12 = log1pf((float)sms_tree->split[2]->sms_none_feat[1]);
      local_2b98 = CONCAT44(fVar12,(undefined4)local_2b98);
      local_2b90 = log1pf((float)sms_tree->split[3]->sms_none_feat[1]);
      local_2b8c = log1pf((float)sms_tree->sms_rect_feat[1]);
      fStack_2b88 = log1pf((float)sms_tree->sms_rect_feat[3]);
      fVar12 = log1pf((float)sms_tree->sms_rect_feat[5]);
      uStack_2b84 = CONCAT44(uStack_2b84._4_4_,fVar12);
      fVar12 = log1pf((float)sms_tree->sms_rect_feat[7]);
      uStack_2b84 = CONCAT44(fVar12,(undefined4)uStack_2b84);
      write_features_to_file
                ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                 &local_2bf8,0x1f,4,bsize,in_stack_ffffffffffffd3c8,mi_col);
      if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
         (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
        min_bh = 4;
        pfVar8 = &local_2bf8;
        pfVar9 = local_2a44;
        for (lVar7 = 0x1f; lVar7 != 0; lVar7 = lVar7 + -1) {
          *pfVar9 = *pfVar8;
          pfVar8 = pfVar8 + (ulong)bVar11 * -2 + 1;
          pfVar9 = pfVar9 + (ulong)bVar11 * -2 + 1;
        }
        av1_ext_part_send_features(ext_part_controller,(aom_partition_features_t *)&min_bh);
        _Var4 = av1_ext_part_get_partition_decision
                          (ext_part_controller,(aom_partition_decision_t *)&score);
        if (_Var4) {
          part_state->terminate_partition_search = local_68;
          return;
        }
      }
      score = 0.0;
      (*av1_nn_predict)(&local_2bf8,pNVar6,1,&score);
      if (score < local_2c24) {
        part_state->terminate_partition_search = 1;
      }
    }
  }
switchD_001ecdc4_caseD_4:
  return;
}

Assistant:

void av1_ml_early_term_after_split(AV1_COMP *const cpi, MACROBLOCK *const x,
                                   SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                   int64_t best_rd, int64_t part_none_rd,
                                   int64_t part_split_rd,
                                   int64_t *split_block_rd,
                                   PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (best_rd <= 0 || best_rd == INT64_MAX ||
      part_state->terminate_partition_search)
    return;

  const AV1_COMMON *const cm = &cpi->common;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const NN_CONFIG *nn_config = NULL;
  float thresh = -1e6;
  switch (bsize) {
    case BLOCK_128X128: break;
    case BLOCK_64X64:
      nn_config = &av1_early_term_after_split_nnconfig_64;
      thresh = is_480p_or_larger ? -2.0f : -1.2f;
      break;
    case BLOCK_32X32:
      nn_config = &av1_early_term_after_split_nnconfig_32;
      thresh = is_480p_or_larger ? -2.6f : -2.3f;
      break;
    case BLOCK_16X16:
      nn_config = &av1_early_term_after_split_nnconfig_16;
      thresh = is_480p_or_larger ? -2.0f : -2.4f;
      break;
    case BLOCK_8X8:
      nn_config = &av1_early_term_after_split_nnconfig_8;
      thresh = is_480p_or_larger ? -1.0f : -1.4f;
      break;
    case BLOCK_4X4: break;
    default:
      assert(0 && "Invalid block size in av1_ml_early_term_after_split().");
      break;
  }
  if (!nn_config) return;

  // Use more conservative threshold for level 1.
  if (cpi->sf.part_sf.ml_early_term_after_part_split_level < 2) thresh -= 0.3f;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const int bs = block_size_wide[bsize];
  int f_idx = 0;
  float features[FEATURES] = { 0.0f };

  features[f_idx++] = log1pf((float)dc_q / 4.0f);
  features[f_idx++] = log1pf((float)best_rd / bs / bs / 1024.0f);

  add_rd_feature(part_none_rd, best_rd, features, &f_idx);
  add_rd_feature(part_split_rd, best_rd, features, &f_idx);

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    add_rd_feature(split_block_rd[i], best_rd, features, &f_idx);
    int min_bw = MAX_SB_SIZE_LOG2;
    int min_bh = MAX_SB_SIZE_LOG2;
    get_min_bsize(sms_tree->split[i], &min_bw, &min_bh);
    features[f_idx++] = (float)min_bw;
    features[f_idx++] = (float)min_bh;
  }

  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, NULL,
                                           FEATURE_SMS_PRUNE_PART_FLAG);

  features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->split[0]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[1]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[2]->sms_none_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->split[3]->sms_none_feat[1]);

  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[1]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[3]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[5]);
  features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[7]);

  assert(f_idx == FEATURES);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features, FEATURES,
                         4, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split(
          cpi, features, &part_state->terminate_partition_search)) {
    return;
  }

  float score = 0.0f;
  av1_nn_predict(features, nn_config, 1, &score);
  // Score is indicator of confidence that we should NOT terminate.
  if (score < thresh) {
    part_state->terminate_partition_search = 1;
  }
}